

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.h
# Opt level: O1

void __thiscall bignum_t<32>::set(bignum_t<32> *this,vm_val_t *val)

{
  int iVar1;
  char *pcVar2;
  double val_00;
  
  if (val->typ == VM_OBJ) {
    iVar1 = (**(code **)(*(long *)&G_obj_table_X.pages_[(val->val).obj >> 0xc]
                                   [(val->val).obj & 0xfff].ptr_ + 8))
                      (G_obj_table_X.pages_[(val->val).obj >> 0xc] + ((val->val).obj & 0xfff),
                       CVmObjBigNum::metaclass_reg_);
    if (iVar1 != 0) {
      pcVar2 = (G_obj_table_X.pages_[(val->val).obj >> 0xc]->ptr_).obj_ +
               ((val->val).obj & 0xfff) * 0x18;
      goto LAB_0025dd28;
    }
  }
  else if (val->typ == VM_INT) {
    CVmObjBigNum::set_int_val(this->ext,(long)(val->val).intval);
    return;
  }
  pcVar2 = (char *)0x0;
LAB_0025dd28:
  if (pcVar2 != (char *)0x0) {
    CVmObjBigNum::copy_val(this->ext,*(char **)(pcVar2 + 8),1);
    return;
  }
  if (val->typ != VM_INT) {
    iVar1 = vm_val_t::nonint_is_numeric(val);
    if (iVar1 == 0) {
      err_throw(0x7d4);
    }
  }
  if (val->typ == VM_INT) {
    val_00 = (double)(val->val).intval;
  }
  else {
    val_00 = vm_val_t::nonint_num_to_double(val);
  }
  CVmObjBigNum::set_double_val(this->ext,val_00);
  return;
}

Assistant:

void set(VMG_ const vm_val_t *val)
    {
        CVmObjBigNum *b;
        if (val->typ == VM_INT)
            CVmObjBigNum::set_int_val(ext, val->val.intval);
        else if ((b = vm_val_cast(CVmObjBigNum, val)) != 0)
            CVmObjBigNum::copy_val(ext, b->get_ext(), TRUE);
        else if (val->is_numeric(vmg0_))
            CVmObjBigNum::set_double_val(ext, val->num_to_double(vmg0_));
        else
            err_throw(VMERR_NUM_VAL_REQD);
    }